

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

_Bool do_vfp_3op_sp(DisasContext_conflict1 *s,undefined1 *fn,int vd,int vn,int vm,_Bool reads_vd)

{
  TCGContext_conflict1 *tcg_ctx;
  uint uVar1;
  _Bool _Var2;
  TCGv_i32 var;
  TCGv_i32 var_00;
  TCGv_i32 var_01;
  TCGv_ptr pTVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = s->isar->mvfr0;
  if ((uVar4 & 0xf0) != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar5 = s->vec_len;
    if (((uVar4 & 0xf000000) != 0) || ((iVar5 == 0 && (s->vec_stride == 0)))) {
      _Var2 = vfp_access_check(s);
      if (!_Var2) {
        return true;
      }
      if (iVar5 < 1) {
        uVar4 = 0;
        uVar1 = 0;
      }
      else if ((vd & 0x18U) == 0) {
        uVar4 = 0;
        iVar5 = 0;
        uVar1 = 0;
      }
      else {
        uVar4 = s->vec_stride + 1;
        uVar1 = vm & 0x18;
        if ((vm & 0x18U) != 0) {
          uVar1 = uVar4;
        }
      }
      var = tcg_temp_new_i32(tcg_ctx);
      var_00 = tcg_temp_new_i32(tcg_ctx);
      var_01 = tcg_temp_new_i32(tcg_ctx);
      pTVar3 = get_fpstatus_ptr_aarch64(tcg_ctx,0);
      neon_load_reg32(tcg_ctx,var,vn);
      neon_load_reg32(tcg_ctx,var_00,vm);
      do {
        iVar5 = -iVar5;
        do {
          if (reads_vd) {
            neon_load_reg32(tcg_ctx,var_01,vd);
          }
          (*(code *)fn)(tcg_ctx,var_01,var,var_00,pTVar3);
          neon_store_reg32(tcg_ctx,var_01,vd);
          iVar5 = iVar5 + 1;
          if (iVar5 == 1) {
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var + (long)tcg_ctx));
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_00 + (long)tcg_ctx));
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(var_01 + (long)tcg_ctx));
            tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
            return true;
          }
          vd = vd & 0xfffffff8U | uVar4 + vd & 7;
          vn = vn & 0xfffffff8U | vn + uVar4 & 7;
          neon_load_reg32(tcg_ctx,var,vn);
        } while (uVar1 == 0);
        vm = vm & 0xfffffff8U | uVar1 + vm & 7;
        neon_load_reg32(tcg_ctx,var_00,vm);
        iVar5 = -iVar5;
      } while( true );
    }
  }
  return false;
}

Assistant:

static bool do_vfp_3op_sp(DisasContext *s, VFPGen3OpSPFn *fn,
                          int vd, int vn, int vm, bool reads_vd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint32_t delta_m = 0;
    uint32_t delta_d = 0;
    int veclen = s->vec_len;
    TCGv_i32 f0, f1, fd;
    TCGv_ptr fpst;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fpshvec, s) &&
        (veclen != 0 || s->vec_stride != 0)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (veclen > 0) {
        /* Figure out what type of vector operation this is.  */
        if (vfp_sreg_is_scalar(vd)) {
            /* scalar */
            veclen = 0;
        } else {
            delta_d = s->vec_stride + 1;

            if (vfp_sreg_is_scalar(vm)) {
                /* mixed scalar/vector */
                delta_m = 0;
            } else {
                /* vector */
                delta_m = delta_d;
            }
        }
    }

    f0 = tcg_temp_new_i32(tcg_ctx);
    f1 = tcg_temp_new_i32(tcg_ctx);
    fd = tcg_temp_new_i32(tcg_ctx);
    fpst = get_fpstatus_ptr(tcg_ctx, 0);

    neon_load_reg32(tcg_ctx, f0, vn);
    neon_load_reg32(tcg_ctx, f1, vm);

    for (;;) {
        if (reads_vd) {
            neon_load_reg32(tcg_ctx, fd, vd);
        }
        fn(tcg_ctx, fd, f0, f1, fpst);
        neon_store_reg32(tcg_ctx, fd, vd);

        if (veclen == 0) {
            break;
        }

        /* Set up the operands for the next iteration */
        veclen--;
        vd = vfp_advance_sreg(vd, delta_d);
        vn = vfp_advance_sreg(vn, delta_d);
        neon_load_reg32(tcg_ctx, f0, vn);
        if (delta_m) {
            vm = vfp_advance_sreg(vm, delta_m);
            neon_load_reg32(tcg_ctx, f1, vm);
        }
    }

    tcg_temp_free_i32(tcg_ctx, f0);
    tcg_temp_free_i32(tcg_ctx, f1);
    tcg_temp_free_i32(tcg_ctx, fd);
    tcg_temp_free_ptr(tcg_ctx, fpst);

    return true;
}